

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

VkExtent2D
vkb::detail::find_extent
          (VkSurfaceCapabilitiesKHR *capabilities,uint32_t desired_width,uint32_t desired_height)

{
  uint uVar1;
  uint b;
  uint uVar2;
  uint32_t desired_height_local;
  uint32_t desired_width_local;
  VkSurfaceCapabilitiesKHR *capabilities_local;
  VkExtent2D actualExtent;
  
  if ((capabilities->currentExtent).width == 0xffffffff) {
    uVar2 = (capabilities->minImageExtent).width;
    uVar1 = minimum<unsigned_int>((capabilities->maxImageExtent).width,desired_width);
    uVar1 = maximum<unsigned_int>(uVar2,uVar1);
    uVar2 = (capabilities->minImageExtent).height;
    b = minimum<unsigned_int>((capabilities->maxImageExtent).height,desired_height);
    uVar2 = maximum<unsigned_int>(uVar2,b);
    capabilities_local = (VkSurfaceCapabilitiesKHR *)CONCAT44(uVar2,uVar1);
  }
  else {
    capabilities_local = *(VkSurfaceCapabilitiesKHR **)&capabilities->currentExtent;
  }
  return (VkExtent2D)capabilities_local;
}

Assistant:

VkExtent2D find_extent(VkSurfaceCapabilitiesKHR const& capabilities, uint32_t desired_width, uint32_t desired_height) {
    if (capabilities.currentExtent.width != UINT32_MAX) {
        return capabilities.currentExtent;
    } else {
        VkExtent2D actualExtent = { desired_width, desired_height };

        actualExtent.width =
            maximum(capabilities.minImageExtent.width, minimum(capabilities.maxImageExtent.width, actualExtent.width));
        actualExtent.height =
            maximum(capabilities.minImageExtent.height, minimum(capabilities.maxImageExtent.height, actualExtent.height));

        return actualExtent;
    }
}